

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularPrimitive::GenerateSwappingCode
          (SingularPrimitive *this,Printer *p)

{
  if ((this->super_FieldGeneratorBase).is_oneof_ != false) {
    return;
  }
  io::Printer::Emit(p,0x70,
                    "\n      //~ A `using std::swap;` is already present in this function.\n      swap($field_$, other->$field_$);\n    "
                   );
  return;
}

Assistant:

void GenerateSwappingCode(io::Printer* p) const override {
    if (is_oneof()) {
      // Don't print any swapping code. Swapping the union will swap this field.
      return;
    }

    p->Emit(R"cc(
      //~ A `using std::swap;` is already present in this function.
      swap($field_$, other->$field_$);
    )cc");
  }